

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

xcb_rectangle_t client_initialize_rect(client *client,monitor *monitor)

{
  xcb_rectangle_t xVar1;
  xcb_rectangle_t local_28;
  xcb_rectangle_t new_rect;
  monitor *monitor_local;
  client *client_local;
  
  local_28 = client->rect;
  if ((client->size_hints->flags & 2) != 0) {
    if (0x7fff < client->size_hints->x) {
      __assert_fail("client->size_hints->x <= INT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/client.c"
                    ,0x89,
                    "xcb_rectangle_t client_initialize_rect(const struct client *, const struct monitor *)"
                   );
    }
    if (0x7fff < client->size_hints->y) {
      __assert_fail("client->size_hints->y <= INT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/client.c"
                    ,0x8a,
                    "xcb_rectangle_t client_initialize_rect(const struct client *, const struct monitor *)"
                   );
    }
    local_28.y = (short)client->size_hints->y;
    local_28.x = (short)client->size_hints->x;
  }
  if ((client->size_hints->flags & 8) != 0) {
    if (0xffff < client->size_hints->width) {
      __assert_fail("client->size_hints->width <= UINT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/client.c"
                    ,0x91,
                    "xcb_rectangle_t client_initialize_rect(const struct client *, const struct monitor *)"
                   );
    }
    if (0xffff < client->size_hints->height) {
      __assert_fail("client->size_hints->height <= UINT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/client.c"
                    ,0x92,
                    "xcb_rectangle_t client_initialize_rect(const struct client *, const struct monitor *)"
                   );
    }
    local_28.width = (short)client->size_hints->width;
    local_28.height = (uint16_t)client->size_hints->height;
  }
  xVar1 = monitor_clamp_client_rect(monitor,local_28);
  return xVar1;
}

Assistant:

static xcb_rectangle_t client_initialize_rect(const struct client *client,
                                              const struct monitor *monitor)
{
        xcb_rectangle_t new_rect = client->rect;

        if (client->size_hints->flags & XCB_ICCCM_SIZE_HINT_US_SIZE) {
                assert(client->size_hints->x <= INT16_MAX);
                assert(client->size_hints->y <= INT16_MAX);

                new_rect.x = (int16_t)client->size_hints->x;
                new_rect.y = (int16_t)client->size_hints->y;
        }

        if (client->size_hints->flags & XCB_ICCCM_SIZE_HINT_P_SIZE) {
                assert(client->size_hints->width <= UINT16_MAX);
                assert(client->size_hints->height <= UINT16_MAX);

                new_rect.width = (uint16_t)client->size_hints->width;
                new_rect.height = (uint16_t)client->size_hints->height;
        }

        return monitor_clamp_client_rect(monitor, new_rect);
}